

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O0

void __thiscall pbrt::FilmBase::FilmBase(FilmBase *this,FilmBaseParameters *p)

{
  uint uVar1;
  int line;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined8 *in_RSI;
  int *in_RDI;
  char (*unaff_retaddr) [19];
  int *in_stack_00000008;
  char (*in_stack_00000010) [17];
  int *in_stack_00000018;
  int vb_3;
  int va_3;
  int vb_2;
  int va_2;
  int vb_1;
  int va_1;
  int vb;
  int va;
  FilterHandle *in_stack_ffffffffffffff78;
  FilterHandle *in_stack_ffffffffffffff80;
  Bounds2<int> *this_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffc4;
  uint in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  LogLevel in_stack_ffffffffffffffe4;
  char *in_stack_ffffffffffffffe8;
  undefined8 *puVar7;
  LogLevel level;
  
  *(undefined8 *)in_RDI = *in_RSI;
  this_00 = (Bounds2<int> *)(in_RDI + 2);
  uVar4 = in_RSI[2];
  *(undefined8 *)(in_RDI + 2) = in_RSI[1];
  *(undefined8 *)(in_RDI + 4) = uVar4;
  puVar7 = in_RSI;
  FilterHandle::FilterHandle(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  level = (LogLevel)((ulong)puVar7 >> 0x20);
  in_RDI[8] = (int)(*(float *)(in_RSI + 4) * 0.001);
  *(undefined8 *)(in_RDI + 10) = in_RSI[5];
  std::__cxx11::string::string((string *)(in_RDI + 0xc),(string *)(in_RSI + 6));
  bVar5 = Bounds2<int>::IsEmpty(this_00);
  uVar6 = CONCAT13(bVar5,(int3)in_stack_ffffffffffffffc0);
  if (bVar5) {
    LogFatal<char_const(&)[23]>
              (in_stack_ffffffffffffffe4,
               (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               in_stack_ffffffffffffffd4,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (char (*) [23])CONCAT44(in_stack_ffffffffffffffc4,uVar6));
  }
  if (in_RDI[2] < 0) {
    LogFatal<char_const(&)[19],char_const(&)[2],char_const(&)[19],int&,char_const(&)[2],int&>
              (level,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
               (char *)(ulong)in_stack_ffffffffffffffd8,
               (char (*) [19])CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (char (*) [2])CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               unaff_retaddr,in_stack_00000008,(char (*) [2])in_stack_00000010,in_stack_00000018);
  }
  uVar1 = in_RDI[4];
  line = *in_RDI;
  if (line < (int)uVar1) {
    LogFatal<char_const(&)[19],char_const(&)[17],char_const(&)[19],int&,char_const(&)[17],int&>
              (level,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,(char *)(ulong)uVar1,
               (char (*) [19])CONCAT44(line,in_stack_ffffffffffffffd0),
               (char (*) [17])CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018);
  }
  iVar2 = in_RDI[3];
  if (iVar2 < 0) {
    LogFatal<char_const(&)[19],char_const(&)[2],char_const(&)[19],int&,char_const(&)[2],int&>
              (level,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,(char *)(ulong)uVar1,
               (char (*) [19])CONCAT44(line,iVar2),(char (*) [2])(ulong)in_stack_ffffffffffffffc8,
               unaff_retaddr,in_stack_00000008,(char (*) [2])in_stack_00000010,in_stack_00000018);
  }
  uVar3 = in_RDI[5];
  if (in_RDI[1] < (int)uVar3) {
    LogFatal<char_const(&)[19],char_const(&)[17],char_const(&)[19],int&,char_const(&)[17],int&>
              (level,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,(char *)(ulong)uVar1,
               (char (*) [19])CONCAT44(line,iVar2),(char (*) [17])(ulong)uVar3,unaff_retaddr,
               in_stack_00000008,in_stack_00000010,in_stack_00000018);
  }
  if (LOGGING_LogLevel < 1) {
    Log<pbrt::Point2<int>&,pbrt::Bounds2<int>&>
              (in_stack_ffffffffffffffe4,(char *)(ulong)uVar1,line,(char *)(ulong)uVar3,
               (Point2<int> *)CONCAT44(in_RDI[1],uVar6),this_00);
  }
  return;
}

Assistant:

FilmBase(FilmBaseParameters p)
        : fullResolution(p.fullResolution),
          pixelBounds(p.pixelBounds),
          filter(p.filter),
          diagonal(p.diagonal * .001f),
          sensor(p.sensor),
          filename(p.filename) {
        CHECK(!pixelBounds.IsEmpty());
        CHECK_GE(pixelBounds.pMin.x, 0);
        CHECK_LE(pixelBounds.pMax.x, fullResolution.x);
        CHECK_GE(pixelBounds.pMin.y, 0);
        CHECK_LE(pixelBounds.pMax.y, fullResolution.y);
        LOG_VERBOSE("Created film with full resolution %s, pixelBounds %s",
                    fullResolution, pixelBounds);
    }